

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O0

gdImagePtr gdImageCreateFromGd2PartPtr(int size,void *data,int srcx,int srcy,int w,int h)

{
  gdIOCtx *in_00;
  gdIOCtx *in;
  gdImagePtr im;
  int h_local;
  int w_local;
  int srcy_local;
  int srcx_local;
  void *data_local;
  gdImagePtr pgStack_10;
  int size_local;
  
  in_00 = gdNewDynamicCtxEx(size,data,0);
  if (in_00 == (gdIOCtx *)0x0) {
    pgStack_10 = (gdImagePtr)0x0;
  }
  else {
    pgStack_10 = gdImageCreateFromGd2PartCtx(in_00,srcx,srcy,w,h);
    (*in_00->gd_free)(in_00);
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2PartPtr (int size, void *data, int srcx, int srcy, int w,
        int h)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx (size, data, 0);
	if(!in)
		return 0;
	im = gdImageCreateFromGd2PartCtx (in, srcx, srcy, w, h);
	in->gd_free (in);
	return im;
}